

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

BBox * __thiscall CMU462::Face::bounds(BBox *__return_storage_ptr__,Face *this)

{
  bool bVar1;
  pointer pHVar2;
  pointer pVVar3;
  _Self local_38;
  _List_node_base *local_30;
  _List_const_iterator<CMU462::Vertex> local_28;
  _List_const_iterator<CMU462::Halfedge> local_20;
  HalfedgeCIter h;
  Face *this_local;
  BBox *box;
  
  h._M_node = (_List_node_base *)this;
  BBox::BBox(__return_storage_ptr__);
  local_20._M_node = (_List_node_base *)halfedge(this);
  do {
    pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_20);
    local_28._M_node = (_List_node_base *)Halfedge::vertex(pHVar2);
    pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_28);
    BBox::expand(__return_storage_ptr__,&pVVar3->position);
    pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_20);
    local_30 = (_List_node_base *)Halfedge::next(pHVar2);
    local_20._M_node = local_30;
    local_38._M_node = (_List_node_base *)halfedge(this);
    bVar1 = std::operator!=(&local_20,&local_38);
  } while (bVar1);
  return __return_storage_ptr__;
}

Assistant:

BBox Face::bounds() const
  {
    BBox box;

    // grow the bounding box to contain
    // all vertices contained in this face
    HalfedgeCIter h = halfedge();
    do
    {
      box.expand( h->vertex()->position );
      h = h->next();
    }
    while( h != halfedge() );

    return box;
  }